

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall Common::File::File(File *this,FILE *fp,bool exclusive)

{
  byte in_DL;
  undefined8 in_RSI;
  _IO_FILE *in_RDI;
  shared_ptr<_IO_FILE> *in_stack_ffffffffffffffb0;
  shared_ptr<_IO_FILE> local_48 [2];
  shared_ptr<_IO_FILE> local_28;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::shared_ptr<_IO_FILE>::shared_ptr((shared_ptr<_IO_FILE> *)in_RDI);
  if ((local_11 & 1) == 0) {
    std::shared_ptr<_IO_FILE>::shared_ptr<_IO_FILE,Common::File::File(_IO_FILE*,bool)::__0,void>
              (local_48,local_10);
    std::shared_ptr<_IO_FILE>::operator=(in_stack_ffffffffffffffb0,(shared_ptr<_IO_FILE> *)in_RDI);
    std::shared_ptr<_IO_FILE>::~shared_ptr(local_48);
  }
  else {
    std::shared_ptr<_IO_FILE>::shared_ptr<_IO_FILE,int(*)(_IO_FILE*),void>
              (in_stack_ffffffffffffffb0,in_RDI,(_func_int__IO_FILE_ptr *)0x1e2911);
    std::shared_ptr<_IO_FILE>::operator=(in_stack_ffffffffffffffb0,(shared_ptr<_IO_FILE> *)in_RDI);
    std::shared_ptr<_IO_FILE>::~shared_ptr(&local_28);
  }
  return;
}

Assistant:

File::File(FILE *fp, bool exclusive) {
	if (exclusive) {
		_file = FilePtr(fp, fclose);
	}
	else {
		_file = FilePtr(fp, [](FILE*) {});
	}
}